

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *
pbrt::Image::GenerateMIPMap
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>
           *__return_storage_ptr__,Image *image,WrapMode2D wrapMode,Allocator alloc)

{
  PixelFormat format;
  PixelFormat format_00;
  uintptr_t uVar1;
  size_t sVar2;
  int32_t iVar3;
  int32_t iVar4;
  Allocator alloc_00;
  int iVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Point2i newResolution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  uint uVar9;
  long end;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_float> buf;
  Point2i levelResolution;
  int nChannels;
  int local_1dc;
  int srcDeltas [4];
  Tuple2<pbrt::Point2,_int> local_1b0;
  uint local_1a4;
  Image **local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  Tuple2<pbrt::Point2,_int> local_190;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_188;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_180;
  _Any_data local_178;
  code *pcStack_168;
  code *pcStack_160;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_158;
  ColorEncodingHandle local_150;
  Image nextImage;
  
  nChannels = (int)(image->channelNames).nStored;
  format = image->format;
  iVar3 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  uVar1 = (image->encoding).
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits;
  if ((POPCOUNT(iVar3) == 1) &&
     (POPCOUNT((image->resolution).super_Tuple2<pbrt::Point2,_int>.y) == 1)) {
    if (format != Float) {
      local_150.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      ConvertToFormat(&nextImage,image,Float,&local_150);
      operator=(image,&nextImage);
      ~Image(&nextImage);
    }
  }
  else {
    iVar3 = RoundUpPow2(iVar3);
    iVar4 = RoundUpPow2((image->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    newResolution.super_Tuple2<pbrt::Point2,_int>.y = iVar4;
    newResolution.super_Tuple2<pbrt::Point2,_int>.x = iVar3;
    FloatResize(&nextImage,image,newResolution,wrapMode);
    operator=(image,&nextImage);
    ~Image(&nextImage);
  }
  if (image->format != Float) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x8b,"Check failed: %s",(char (*) [22])"Is32Bit(image.format)");
  }
  iVar6 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  iVar5 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (Image *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
            (__return_storage_ptr__,(ulong)(0x20 - LZCOUNT(iVar5)));
  local_1a0 = &__return_storage_ptr__->ptr;
  uVar9 = LZCOUNT(iVar5) ^ 0x1f;
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(image->channelNames).field_2;
  levelResolution.super_Tuple2<pbrt::Point2,_int> =
       (image->resolution).super_Tuple2<pbrt::Point2,_int>;
  local_1a4 = uVar9;
  local_198 = pbVar8;
  for (local_1dc = 0; local_1dc < (int)uVar9; local_1dc = local_1dc + 1) {
    pbVar7 = (image->channelNames).ptr;
    if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar7 = pbVar8;
    }
    channels.n = (image->channelNames).nStored;
    channels.ptr = pbVar7;
    local_180.bits = uVar1;
    Image(&nextImage,format,levelResolution,channels,(ColorEncodingHandle *)&local_180,alloc);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
              (__return_storage_ptr__,&nextImage);
    ~Image(&nextImage);
    auVar10._8_8_ = 0;
    auVar10._0_4_ = levelResolution.super_Tuple2<pbrt::Point2,_int>.x;
    auVar10._4_4_ = levelResolution.super_Tuple2<pbrt::Point2,_int>.y;
    auVar11 = vpsrld_avx(auVar10,0x1f);
    auVar11 = vpaddd_avx(auVar10,auVar11);
    auVar10 = vpsrad_avx(auVar11,1);
    auVar11._8_4_ = 1;
    auVar11._0_8_ = 0x100000001;
    auVar11._12_4_ = 1;
    auVar11 = vpmaxsd_avx512vl(auVar10,auVar11);
    local_1b0 = auVar11._0_8_;
    pbVar7 = (image->channelNames).ptr;
    format_00 = image->format;
    if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar7 = pbVar8;
    }
    sVar2 = (image->channelNames).nStored;
    local_190 = local_1b0;
    local_188.bits = uVar1;
    alloc_00.memoryResource = pstd::pmr::new_delete_resource();
    channels_00.n = sVar2;
    channels_00.ptr = pbVar7;
    Image(&nextImage,format_00,(Point2i)local_190,channels_00,(ColorEncodingHandle *)&local_188,
          alloc_00);
    srcDeltas[0] = 0;
    iVar6 = levelResolution.super_Tuple2<pbrt::Point2,_int>.x * nChannels;
    srcDeltas[1] = nChannels;
    srcDeltas[3] = nChannels + iVar6;
    if (levelResolution.super_Tuple2<pbrt::Point2,_int>.x == 1) {
      srcDeltas[1] = 0;
      srcDeltas[3] = iVar6;
    }
    srcDeltas[2] = iVar6;
    if (levelResolution.super_Tuple2<pbrt::Point2,_int>.y == 1) {
      srcDeltas[2] = 0;
      srcDeltas[3] = srcDeltas[3] - iVar6;
    }
    end = (long)local_1b0.y;
    local_178._M_unused._M_object = (void *)0x0;
    local_178._8_8_ = 0;
    pcStack_168 = (code *)0x0;
    pcStack_160 = (code *)0x0;
    local_178._M_unused._M_object = operator_new(0x40);
    pbVar8 = local_198;
    *(Image **)local_178._M_unused._0_8_ = image;
    *(Image **)((long)local_178._M_unused._0_8_ + 8) = &nextImage;
    *(Tuple2<pbrt::Point2,_int> **)((long)local_178._M_unused._0_8_ + 0x10) = &local_1b0;
    *(int **)((long)local_178._M_unused._0_8_ + 0x18) = &nChannels;
    *(int **)((long)local_178._M_unused._0_8_ + 0x20) = srcDeltas;
    *(Point2i **)((long)local_178._M_unused._0_8_ + 0x28) = &levelResolution;
    *(vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> **)
     ((long)local_178._M_unused._0_8_ + 0x30) = __return_storage_ptr__;
    *(int **)((long)local_178._M_unused._0_8_ + 0x38) = &local_1dc;
    pcStack_160 = std::
                  _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp:172:43)>
                  ::_M_invoke;
    pcStack_168 = std::
                  _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp:172:43)>
                  ::_M_manager;
    ParallelFor(0,end,(function<void_(long,_long)> *)&local_178);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    operator=(image,&nextImage);
    uVar9 = local_1a4;
    levelResolution.super_Tuple2<pbrt::Point2,_int> = local_1b0;
    ~Image(&nextImage);
  }
  if ((levelResolution.super_Tuple2<pbrt::Point2,_int>.x == 1) &&
     (levelResolution.super_Tuple2<pbrt::Point2,_int>.y == 1)) {
    pbVar7 = (image->channelNames).ptr;
    if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar8 = pbVar7;
    }
    channels_01.n = (image->channelNames).nStored;
    channels_01.ptr = pbVar8;
    local_158.bits = uVar1;
    Image(&nextImage,format,levelResolution,channels_01,(ColorEncodingHandle *)&local_158,alloc);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
              (__return_storage_ptr__,&nextImage);
    ~Image(&nextImage);
    nextImage.format = U256;
    nextImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
    nextImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = 1;
    nextImage._12_4_ = 1;
    buf.n = (size_t)nChannels;
    buf.ptr = (image->p32).ptr;
    CopyRectIn(*local_1a0 + uVar9,(Bounds2i *)&nextImage,buf);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[51]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0xcd,"Check failed: %s",
             (char (*) [51])"levelResolution[0] == 1 && levelResolution[1] == 1");
}

Assistant:

pstd::vector<Image> Image::GenerateMIPMap(Image image, WrapMode2D wrapMode,
                                          Allocator alloc) {
    PixelFormat origFormat = image.format;
    int nChannels = image.NChannels();
    ColorEncodingHandle origEncoding = image.encoding;

    // Set things up so we have a power-of-two sized image stored with
    // floats.
    if (!IsPowerOf2(image.resolution[0]) || !IsPowerOf2(image.resolution[1])) {
        // Resample image to power-of-two resolution
        image = image.FloatResize(
            {RoundUpPow2(image.resolution[0]), RoundUpPow2(image.resolution[1])},
            wrapMode);
    } else if (!Is32Bit(image.format))
        image = image.ConvertToFormat(PixelFormat::Float);
    CHECK(Is32Bit(image.format));

    // Initialize levels of MIPMap from image
    int nLevels = 1 + Log2Int(std::max(image.resolution[0], image.resolution[1]));
    pstd::vector<Image> pyramid(alloc);
    pyramid.reserve(nLevels);

    Point2i levelResolution = image.resolution;
    for (int i = 0; i < nLevels - 1; ++i) {
        // Initialize $i+1$st MIPMap level from $i$th level and also convert
        // i'th level to the internal format
        pyramid.push_back(
            Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));

        Point2i nextResolution(std::max(1, levelResolution[0] / 2),
                               std::max(1, levelResolution[1] / 2));
        Image nextImage(image.format, nextResolution, image.channelNames, origEncoding);

        // Offsets from the base pixel to the four neighbors that we'll
        // downfilter.
        int srcDeltas[4] = {0, nChannels, nChannels * levelResolution[0],
                            nChannels * levelResolution[0] + nChannels};
        // Clamp offsets once a dimension has a single texel.
        if (levelResolution[0] == 1) {
            srcDeltas[1] = 0;
            srcDeltas[3] -= nChannels;
        }
        if (levelResolution[1] == 1) {
            srcDeltas[2] = 0;
            srcDeltas[3] -= nChannels * levelResolution[0];
        }

        // Work in scanlines for best cache coherence (vs 2d tiles).
        ParallelFor(0, nextResolution[1], [&](int64_t y0, int64_t y1) {
            for (int y = y0; y < y1; ++y) {
                // Downfilter with a box filter for the next MIP level
                int srcOffset = image.PixelOffset({0, 2 * y});
                int nextOffset = nextImage.PixelOffset({0, y});
                for (int x = 0; x < nextResolution[0]; ++x) {
                    for (int c = 0; c < nChannels; ++c) {
                        nextImage.p32[nextOffset] =
                            .25f *
                            (image.p32[srcOffset] + image.p32[srcOffset + srcDeltas[1]] +
                             image.p32[srcOffset + srcDeltas[2]] +
                             image.p32[srcOffset + srcDeltas[3]]);
                        ++srcOffset;
                        ++nextOffset;
                    }
                    srcOffset += nChannels;
                }

                // Copy the current level out to the current pyramid level
                int yStart = 2 * y;
                int yEnd = std::min(2 * y + 2, levelResolution[1]);
                int offset = image.PixelOffset({0, yStart});
                size_t count = (yEnd - yStart) * nChannels * levelResolution[0];
                pyramid[i].CopyRectIn(Bounds2i({0, yStart}, {levelResolution[0], yEnd}),
                                      {image.p32.data() + offset, count});
            }
        });

        image = std::move(nextImage);
        levelResolution = nextResolution;
    }

    // Top level
    CHECK(levelResolution[0] == 1 && levelResolution[1] == 1);
    pyramid.push_back(
        Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));
    pyramid[nLevels - 1].CopyRectIn({{0, 0}, {1, 1}},
                                    {image.p32.data(), size_t(nChannels)});

    return pyramid;
}